

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

short __thiscall flatbuffers::Table::GetField<short>(Table *this,voffset_t field,short defaultval)

{
  voffset_t vVar1;
  short local_22;
  voffset_t field_offset;
  short defaultval_local;
  voffset_t field_local;
  Table *this_local;
  
  vVar1 = GetOptionalFieldOffset(this,field);
  local_22 = defaultval;
  if (vVar1 != 0) {
    local_22 = ReadScalar<short>(this + (int)(uint)vVar1);
  }
  return local_22;
}

Assistant:

T GetField(voffset_t field, T defaultval) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return field_offset ? ReadScalar<T>(data_ + field_offset) : defaultval;
  }